

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

bool __thiscall slang::parsing::Parser::isConditionalExpression(Parser *this)

{
  uint32_t offset;
  bool bVar1;
  TokenKind TVar2;
  TokenKind start;
  byte unaff_BPL;
  Token TVar3;
  uint32_t index;
  uint32_t local_24;
  
  local_24 = 1;
  do {
    offset = local_24;
    local_24 = local_24 + 1;
    TVar3 = ParserBase::peek(&this->super_ParserBase,offset);
    TVar2 = TVar3.kind;
    switch(TVar2) {
    case OpenBrace:
      start = OpenBrace;
      TVar2 = CloseBrace;
      break;
    case CloseBrace:
    case CloseBracket:
    case OpenParenthesisStar:
switchD_0031dbac_caseD_e:
      bVar1 = slang::syntax::SyntaxFacts::isNotInType(TVar2);
      if (bVar1) goto switchD_0031dbac_caseD_13;
      goto LAB_0031dbd6;
    case OpenBracket:
      start = OpenBracket;
      TVar2 = CloseBracket;
      break;
    case OpenParenthesis:
      start = OpenParenthesis;
      TVar2 = CloseParenthesis;
      break;
    case CloseParenthesis:
      goto switchD_0031dbac_caseD_13;
    default:
      if (TVar2 != Question) goto switchD_0031dbac_caseD_e;
      unaff_BPL = 1;
      goto LAB_0031dc07;
    }
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>(this,&local_24,start,TVar2);
    if (bVar1) {
LAB_0031dbd6:
      bVar1 = true;
    }
    else {
switchD_0031dbac_caseD_13:
      unaff_BPL = 0;
LAB_0031dc07:
      bVar1 = false;
    }
    if (!bVar1) {
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool Parser::isConditionalExpression() {
    uint32_t index = 1;
    while (true) {
        TokenKind kind = peek(index++).kind;
        switch (kind) {
            case TokenKind::Question:
                return true;
            case TokenKind::CloseParenthesis:
                return false;
            case TokenKind::OpenParenthesis:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                               TokenKind::CloseParenthesis)) {
                    return false;
                }
                break;
            case TokenKind::OpenBrace:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBrace,
                                               TokenKind::CloseBrace)) {
                    return false;
                }
                break;
            case TokenKind::OpenBracket:
                if (!scanTypePart<isNotInType>(index, TokenKind::OpenBracket,
                                               TokenKind::CloseBracket)) {
                    return false;
                }
                break;
            default:
                if (isNotInType(kind))
                    return false;
                break;
        }
    }
}